

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O2

int main(int argc,char **argv)

{
  void *pvVar1;
  nva_card **ppnVar2;
  int iVar3;
  uint32_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t (*pauVar7) [6];
  int iVar8;
  uint __pid;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  int s;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  size_t __size;
  uint32_t tab [12288] [6];
  
  iVar3 = nva_init();
  if (iVar3 == 0) {
    do {
      while (iVar3 = getopt(argc,argv,"c:"), iVar3 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar3 != -1);
    if (cnum < nva_cardsnum) {
      nv50_graph_reset();
      pvVar1 = nva_cards[cnum]->bar0;
      *(undefined4 *)((long)pvVar1 + 0x1700) = 0x400;
      *(undefined4 *)((long)pvVar1 + 0x700020) = 0x190000;
      *(undefined4 *)((long)pvVar1 + 0x700024) = 0x4080000;
      *(undefined4 *)((long)pvVar1 + 0x700028) = 0x4010000;
      *(undefined4 *)((long)pvVar1 + 0x70002c) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700030) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700034) = 0x10000;
      *(undefined4 *)((long)pvVar1 + 0x700200) = 0x190000;
      *(undefined4 *)((long)pvVar1 + 0x700204) = 0x4080000;
      *(undefined4 *)((long)pvVar1 + 0x700208) = 0x4010000;
      *(undefined4 *)((long)pvVar1 + 0x70020c) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700210) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700214) = 0x10000;
      uVar11 = 0;
      iVar3 = 0;
      do {
        if (uVar11 == 0x10) {
          return 0;
        }
        uVar16 = (ulong)(iVar3 * 4 & 0x1c);
        __pid = (uint)uVar11;
        uVar9 = __pid;
        printf("Strand %d!\n");
        uVar6 = uVar11 & 0xffffffff;
        kill(__pid,uVar9);
        ppnVar2 = nva_cards;
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0xdeafbeef;
        }
        strread((int)uVar6,0);
        ppnVar2 = nva_cards;
        pvVar1 = nva_cards[cnum]->bar0;
        pauVar7 = tab;
        for (uVar5 = uVar16; uVar5 < 0x60000; uVar5 = uVar5 + 0x20) {
          uVar9 = *(uint *)((long)pvVar1 + uVar5 + 0x710000);
          uVar6 = (ulong)uVar9;
          (*pauVar7)[0] = uVar9;
          pauVar7 = pauVar7 + 1;
        }
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
        }
        strwrite((int)uVar6,0);
        ppnVar2 = nva_cards;
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
        }
        strread((int)uVar6,0);
        ppnVar2 = nva_cards;
        pvVar1 = nva_cards[cnum]->bar0;
        puVar4 = tab[0] + 1;
        for (uVar5 = uVar16; uVar5 < 0x60000; uVar5 = uVar5 + 0x20) {
          uVar9 = *(uint *)((long)pvVar1 + uVar5 + 0x710000);
          uVar6 = (ulong)uVar9;
          *puVar4 = uVar9;
          puVar4 = puVar4 + 6;
        }
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0xffffffff;
        }
        strwrite((int)uVar6,0);
        ppnVar2 = nva_cards;
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
        }
        strread((int)uVar6,0);
        ppnVar2 = nva_cards;
        pvVar1 = nva_cards[cnum]->bar0;
        puVar4 = tab[0] + 2;
        for (uVar5 = uVar16; uVar5 < 0x60000; uVar5 = uVar5 + 0x20) {
          uVar9 = *(uint *)((long)pvVar1 + uVar5 + 0x710000);
          uVar6 = (ulong)uVar9;
          *puVar4 = uVar9;
          puVar4 = puVar4 + 6;
        }
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
        }
        strwrite((int)uVar6,8);
        ppnVar2 = nva_cards;
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
        }
        strread((int)uVar6,8);
        ppnVar2 = nva_cards;
        pvVar1 = nva_cards[cnum]->bar0;
        puVar4 = tab[0] + 3;
        for (uVar5 = uVar16; uVar5 < 0x60000; uVar5 = uVar5 + 0x20) {
          uVar9 = *(uint *)((long)pvVar1 + uVar5 + 0x710000);
          uVar6 = (ulong)uVar9;
          *puVar4 = uVar9;
          puVar4 = puVar4 + 6;
        }
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0xffffffff;
        }
        strwrite((int)uVar6,8);
        ppnVar2 = nva_cards;
        for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
        }
        strread((int)uVar6,8);
        pvVar1 = nva_cards[cnum]->bar0;
        puVar4 = tab[0] + 5;
        for (uVar5 = uVar16; uVar5 < 0x60000; uVar5 = uVar5 + 0x20) {
          uVar9 = *(uint *)((long)pvVar1 + uVar5 + 0x710000);
          uVar6 = (ulong)uVar9;
          puVar4[-1] = uVar9;
          *puVar4 = 0;
          puVar4 = puVar4 + 6;
        }
        for (iVar8 = 0; ppnVar2 = nva_cards, iVar8 != 0x20; iVar8 = iVar8 + 1) {
          for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
            *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0xffffffff;
          }
          strwrite((int)uVar6,8);
          uVar9 = 1 << ((byte)iVar8 & 0x1f);
          pvVar1 = nva_cards[cnum]->bar0;
          *(uint *)((long)pvVar1 + 0x400040) = uVar9;
          *(undefined4 *)((long)pvVar1 + 0x400040) = 0;
          strwait();
          ppnVar2 = nva_cards;
          for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
            *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
          }
          strread((int)uVar6,8);
          pvVar1 = nva_cards[cnum]->bar0;
          puVar4 = tab[0] + 5;
          for (uVar5 = uVar16; uVar5 < 0x60000; uVar5 = uVar5 + 0x20) {
            uVar6 = (ulong)puVar4[-1];
            if (puVar4[-1] != *(uint *)((long)pvVar1 + uVar5 + 0x710000)) {
              *puVar4 = *puVar4 | uVar9;
            }
            puVar4 = puVar4 + 6;
          }
        }
        uVar9 = (__pid & 7) * 4;
        puVar4 = tab[0] + 4;
        for (uVar5 = 0; uVar5 != 0x3000; uVar5 = uVar5 + 1) {
          if (((*(uint32_t (*) [6])(puVar4 + -4))[0] == 0xdeafbeef) && (*puVar4 == 0)) {
            slen[uVar11] = (int)uVar5;
            goto LAB_00102b71;
          }
          puVar4 = puVar4 + 6;
        }
        uVar5 = (ulong)(uint)slen[uVar11];
LAB_00102b71:
        uVar6 = 0;
        if ((int)uVar5 != 0) {
          pcVar14 = "Initial length: %04x\n";
          printf("Initial length: %04x\n");
          iVar8 = slen[uVar11];
          while (ppnVar2 = nva_cards, s = (int)pcVar14, iVar8 != 0) {
            for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
            }
            *(undefined4 *)
             ((long)ppnVar2[cnum]->bar0 + (ulong)(slen[uVar11] * 0x20 + uVar9 + 0x70ffe0)) =
                 0xffffffff;
            strwrite(s,8);
            ppnVar2 = nva_cards;
            for (uVar5 = 0; uVar5 < 0x70000; uVar5 = uVar5 + 4) {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar5 + 0x710000) = 0;
            }
            strread(s,8);
            uVar15 = slen[uVar11];
            if (*(int *)((long)nva_cards[cnum]->bar0 + (ulong)(uVar15 * 0x20 + uVar9 + 0x70ffe0)) !=
                0) {
              uVar6 = (ulong)uVar15;
              break;
            }
            iVar8 = uVar15 - 1;
            slen[uVar11] = iVar8;
            pcVar14 = (char *)slen;
          }
        }
        pcVar14 = "Length: %04x\n";
        printf("Length: %04x\n",uVar6);
        for (lVar10 = 0; lVar10 != 0x400; lVar10 = lVar10 + 1) {
          iVar8 = 0;
          uVar15 = 0xffffffff;
          for (uVar5 = 1; ppnVar2 = nva_cards, uVar5 != 0x14; uVar5 = uVar5 + 1) {
            for (uVar6 = 0; uVar6 < 0x70000; uVar6 = uVar6 + 4) {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710000) = 0;
            }
            strwrite((int)pcVar14,8);
            ppnVar2 = nva_cards;
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 * 4 + 0x400420) = 0xffffffff;
            }
            pvVar1 = ppnVar2[cnum]->bar0;
            *(int *)((long)pvVar1 + 0x400408) = (int)lVar10 << 0x10;
            *(uint *)((long)pvVar1 + 0x400404) =
                 (__pid & 8) << 9 | (__pid & 7) << 8 | (uint)uVar5 | 0x30000;
            strwait();
            strread((int)pcVar14,8);
            uVar15 = 0xffffffff;
            iVar8 = 0;
            for (uVar6 = 0; uVar6 < 0x70000; uVar6 = uVar6 + 4) {
              bVar17 = *(int *)((long)nva_cards[cnum]->bar0 + uVar6 + 0x710000) != 0;
              bVar18 = ((uint)uVar6 & 0x1c) == uVar9;
              bVar13 = bVar18 && bVar17;
              pcVar14 = (char *)(ulong)bVar13;
              uVar12 = (uint)(uVar6 >> 5) & 0x7ffffff;
              if (uVar15 != 0xffffffff) {
                uVar12 = uVar15;
              }
              if (bVar18 && bVar17) {
                uVar15 = uVar12;
              }
              iVar8 = iVar8 + (uint)bVar13;
            }
            if (iVar8 - 1 < uVar5) goto LAB_00102dc8;
          }
          uVar5 = 0x14;
LAB_00102dc8:
          if (uVar15 == 0xffffffff) {
            seekcnt[uVar11] = (int)lVar10;
            break;
          }
          if (iVar8 != (int)uVar5) {
            __assert_fail("ctr == l",
                          "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nva/nvastrscan.c"
                          ,0x106,"int main(int, char **)");
          }
          pcVar14 = "SEEK: %04x [%d/%d]...\n";
          printf("SEEK: %04x [%d/%d]...\n",(ulong)uVar15,uVar5 & 0xffffffff,uVar5 & 0xffffffff);
          seekstart[uVar11][lVar10] = uVar15;
          seeksize[uVar11][lVar10] = (int)uVar5;
        }
        puVar4 = tab[0] + 5;
        uVar9 = 0;
        for (uVar5 = 0; (long)uVar5 < (long)slen[uVar11]; uVar5 = uVar5 + 1) {
          lVar10 = (long)(int)uVar9;
          if (((int)uVar9 < seekcnt[uVar11]) && (uVar5 == (uint)seekstart[uVar11][lVar10])) {
            printf("\nSEEK %03x [unit %x]\n",(ulong)uVar9,(ulong)(uint)seeksize[uVar11][lVar10]);
            uVar9 = uVar9 + 1;
          }
          else if (uVar9 == 0) {
            uVar9 = 0;
          }
          else {
            iVar8 = *(int *)(uVar11 * 0x1000 + 0x118abc + lVar10 * 4);
            if ((iVar8 != 1) && (((int)uVar5 - seekstart[uVar11 - 1][lVar10 + 0x3ff]) % iVar8 == 0))
            {
              putchar(10);
            }
          }
          printf("%04x: %08x %08x %08x %08x %08x %08x\n",uVar5 & 0xffffffff,
                 (ulong)(*(uint32_t (*) [6])(puVar4 + -5))[0],(ulong)puVar4[-4],(ulong)puVar4[-3],
                 (ulong)puVar4[-2],(ulong)puVar4[-1],(ulong)*puVar4);
          puVar4 = puVar4 + 6;
        }
        uVar11 = uVar11 + 1;
        iVar3 = iVar3 + 1;
      } while( true );
    }
    if (nva_cardsnum == 0) {
      pcVar14 = "No cards found.\n";
      __size = 0x10;
    }
    else {
      pcVar14 = "No such card.\n";
      __size = 0xe;
    }
  }
  else {
    pcVar14 = "PCI init failure!\n";
    __size = 0x12;
  }
  fwrite(pcVar14,__size,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv){
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	nv50_graph_reset();
	nva_wr32(cnum, 0x1700, 0x400);
	nva_wr32(cnum, 0x700020, 0x190000);
	nva_wr32(cnum, 0x700024, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700028, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70002c, 0);
	nva_wr32(cnum, 0x700030, 0);
	nva_wr32(cnum, 0x700034, 0x10000);
	nva_wr32(cnum, 0x700200, 0x190000);
	nva_wr32(cnum, 0x700204, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700208, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70020c, 0);
	nva_wr32(cnum, 0x700210, 0);
	nva_wr32(cnum, 0x700214, 0x10000);

	int j;
	int k;

	for (j = 0; j < 16; j++) {
		printf ("Strand %d!\n", j);
		uint32_t tab[0x3000][6];
		kill(j);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0xdeafbeef);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][0] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][1] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][2] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][3] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][4] = nva_rd32(cnum, 0x710000 + k);
			tab[k/32][5] = 0;
		}

		int z;
		for (z = 0; z < 32; z++) {
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, -1);
			strwrite(j, 8);
			nva_wr32(cnum, 0x400040, 1 << z);
			nva_wr32(cnum, 0x400040, 0);
			strwait();
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, 0);
			strread(j, 8);
			for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
				if (tab[k/32][4] != nva_rd32(cnum, 0x710000 + k))
					tab[k/32][5] |= 1 << z;
			}
		}

		for (k = 0; k < 0x3000; k++)
			if (tab[k][0] == 0xdeafbeef && !tab[k][4]) {
				slen[j] = k;
				break;
			}

		if (slen[j]) {
			printf ("Initial length: %04x\n", slen[j]);
			while (slen[j]) {
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				nva_wr32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32, 0xffffffff);
				strwrite(j, 8);
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strread(j, 8);
				if (nva_rd32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32)) {
					break;
				} else {
					slen[j]--;
				}
			}
		}
		printf ("Length: %04x\n", slen[j]);

		int i;
		for (i = 0; i < 0x400; i++) {
			int pos = -1;
			int l;
			int ctr = 0;
//			int try;
			for (l = 1; l < 0x14; l++) {
//				try = 0;
//respin:
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strwrite(j, 8);
				for (k = 0; k < l; k++)
					nva_wr32(cnum, 0x400420 + k * 4, 0xffffffff);
				nva_wr32(cnum, 0x400408, i << 16);
				nva_wr32(cnum, 0x400404, 0x30000 | (j & 7) << 8 | (j&8) << (12-3) | l);
				strwait();
				strread(j, 8);
				ctr = 0;
				pos = -1;
				for (k = 0; k < 0x70000; k += 4)
					if (nva_rd32(cnum, 0x710000 + k) && (k & 0x1c) == (j & 7) << 2) {
						if (pos == -1)
							pos = k / 32;
						ctr++;
//						printf ("%04x: %08x\n", k/32, nva_rd32(cnum, 0x710000 + k));
					}
				if (ctr <= l && ctr)
					break;
//				else
//					if (try++ < 4)
//						goto respin;
			}
			if (pos == -1) {
				seekcnt[j] = i;
				break;
			}
			assert(ctr == l);
			printf ("SEEK: %04x [%d/%d]...\n", pos, ctr, l);
			seekstart[j][i] = pos;
			seeksize[j][i] = l;
		}

		i = 0;
		for (k = 0; k < slen[j]; k++) {
			if (i < seekcnt[j] && k == seekstart[j][i]) {
				printf ("\nSEEK %03x [unit %x]\n", i, seeksize[j][i]);
				i++;
			} else if (i && seeksize[j][i-1] != 1 && !((k - seekstart[j][i-1])%seeksize[j][i-1]))
				printf ("\n");
			printf ("%04x: %08x %08x %08x %08x %08x %08x\n", k, tab[k][0], tab[k][1], tab[k][2], tab[k][3], tab[k][4], tab[k][5]);
		}
	}


	return 0;
}